

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDFObjectHandle qpdf_oh_item_internal(qpdf_data qpdf,qpdf_oh item)

{
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  QPDFObjectHandle QVar1;
  anon_class_1_0_00000001 local_69;
  function<QPDFObjectHandle_(QPDFObjectHandle_&)> local_68;
  anon_class_1_0_00000001 local_41;
  function<QPDFObjectHandle_(QPDFObjectHandle_&)> local_40;
  undefined8 uStack_18;
  qpdf_oh item_local;
  qpdf_data qpdf_local;
  
  uStack_18 = CONCAT44(in_register_00000034,item);
  qpdf_local = qpdf;
  std::function<QPDFObjectHandle()>::
  function<qpdf_oh_item_internal(_qpdf_data*,unsigned_int)::__0,void>
            ((function<QPDFObjectHandle()> *)&local_40,&local_41);
  std::function<QPDFObjectHandle(QPDFObjectHandle&)>::
  function<qpdf_oh_item_internal(_qpdf_data*,unsigned_int)::__1,void>
            ((function<QPDFObjectHandle(QPDFObjectHandle&)> *)&local_68,&local_69);
  do_with_oh<QPDFObjectHandle>(qpdf,item,(function<QPDFObjectHandle_()> *)(ulong)in_EDX,&local_40);
  std::function<QPDFObjectHandle_(QPDFObjectHandle_&)>::~function(&local_68);
  std::function<QPDFObjectHandle_()>::~function((function<QPDFObjectHandle_()> *)&local_40);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)qpdf;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static QPDFObjectHandle
qpdf_oh_item_internal(qpdf_data qpdf, qpdf_oh item)
{
    return do_with_oh<QPDFObjectHandle>(
        qpdf,
        item,
        []() { return QPDFObjectHandle::newNull(); },
        [](QPDFObjectHandle& o) { return o; });
}